

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

uint HUF_optimalTableLog(uint maxTableLog,size_t srcSize,uint maxSymbolValue,void *workSpace,
                        size_t wkspSize,HUF_CElt *table,uint *count,int flags)

{
  uint maxSymbolValue_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  HUF_CElt *CTable;
  uint *count_00;
  size_t sVar4;
  long in_RCX;
  uint in_EDX;
  ulong in_RSI;
  uint in_EDI;
  void *in_R8;
  size_t in_R9;
  uint optLogGuess;
  uint optLog;
  size_t optSize;
  uint minTableLog;
  uint symbolCardinality;
  size_t newSize;
  size_t hSize;
  size_t maxBits;
  size_t dstSize;
  BYTE *dst;
  uint in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  size_t in_stack_ffffffffffffff98;
  uint *puVar5;
  uint in_stack_ffffffffffffffa4;
  uint *in_stack_ffffffffffffffa8;
  HUF_CElt *in_stack_ffffffffffffffb0;
  void *in_stack_ffffffffffffffb8;
  uint local_4;
  
  if (in_RSI < 2) {
    __assert_fail("srcSize > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x3fbc,
                  "unsigned int HUF_optimalTableLog(unsigned int, size_t, unsigned int, void *, size_t, HUF_CElt *, const unsigned int *, int)"
                 );
  }
  if (in_R8 < (void *)0x1300) {
    __assert_fail("wkspSize >= sizeof(HUF_buildCTable_wksp_tables)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x3fbd,
                  "unsigned int HUF_optimalTableLog(unsigned int, size_t, unsigned int, void *, size_t, HUF_CElt *, const unsigned int *, int)"
                 );
  }
  if (((uint)optSize & 2) == 0) {
    local_4 = FSE_optimalTableLog_internal
                        (in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98,
                         in_stack_ffffffffffffff94,in_stack_ffffffffffffff90);
  }
  else {
    CTable = (HUF_CElt *)(in_RCX + 0x2ec);
    count_00 = (uint *)((long)in_R8 - 0x2ec);
    maxSymbolValue_00 = HUF_cardinality(_optLogGuess,in_EDX);
    uVar1 = HUF_minTableLog(0);
    puVar5 = (uint *)0xfffffffffffffffe;
    local_4 = in_EDI;
    for (uVar3 = uVar1; uVar3 <= in_EDI; uVar3 = uVar3 + 1) {
      in_stack_ffffffffffffffb8 =
           (void *)HUF_buildCTable_wksp
                             (CTable,count_00,(U32)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                              (U32)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                              (size_t)in_stack_ffffffffffffffa8);
      uVar2 = ERR_isError((size_t)in_stack_ffffffffffffffb8);
      if (uVar2 == 0) {
        if ((in_stack_ffffffffffffffb8 < (void *)(ulong)uVar3) && (uVar1 < uVar3)) break;
        in_stack_ffffffffffffffb0 =
             (HUF_CElt *)
             HUF_writeCTable_wksp
                       (in_R8,in_R9,CTable,(uint)((ulong)count_00 >> 0x20),(uint)count_00,
                        in_stack_ffffffffffffffb8,in_RSI);
        uVar2 = ERR_isError((size_t)in_stack_ffffffffffffffb0);
        if (uVar2 == 0) {
          sVar4 = HUF_estimateCompressedSize
                            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,maxSymbolValue_00);
          in_stack_ffffffffffffffa8 = (uint *)(sVar4 + (long)in_stack_ffffffffffffffb0);
          if ((uint *)((long)puVar5 + 1U) < in_stack_ffffffffffffffa8) break;
          if (in_stack_ffffffffffffffa8 < puVar5) {
            local_4 = uVar3;
            puVar5 = in_stack_ffffffffffffffa8;
          }
        }
      }
    }
    if (0xc < local_4) {
      __assert_fail("optLog <= HUF_TABLELOG_MAX",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x3fe5,
                    "unsigned int HUF_optimalTableLog(unsigned int, size_t, unsigned int, void *, size_t, HUF_CElt *, const unsigned int *, int)"
                   );
    }
  }
  return local_4;
}

Assistant:

unsigned HUF_optimalTableLog(
            unsigned maxTableLog,
            size_t srcSize,
            unsigned maxSymbolValue,
            void* workSpace, size_t wkspSize,
            HUF_CElt* table,
      const unsigned* count,
            int flags)
{
    assert(srcSize > 1); /* Not supported, RLE should be used instead */
    assert(wkspSize >= sizeof(HUF_buildCTable_wksp_tables));

    if (!(flags & HUF_flags_optimalDepth)) {
        /* cheap evaluation, based on FSE */
        return FSE_optimalTableLog_internal(maxTableLog, srcSize, maxSymbolValue, 1);
    }

    {   BYTE* dst = (BYTE*)workSpace + sizeof(HUF_WriteCTableWksp);
        size_t dstSize = wkspSize - sizeof(HUF_WriteCTableWksp);
        size_t maxBits, hSize, newSize;
        const unsigned symbolCardinality = HUF_cardinality(count, maxSymbolValue);
        const unsigned minTableLog = HUF_minTableLog(symbolCardinality);
        size_t optSize = ((size_t) ~0) - 1;
        unsigned optLog = maxTableLog, optLogGuess;

        DEBUGLOG(6, "HUF_optimalTableLog: probing huf depth (srcSize=%zu)", srcSize);

        /* Search until size increases */
        for (optLogGuess = minTableLog; optLogGuess <= maxTableLog; optLogGuess++) {
            DEBUGLOG(7, "checking for huffLog=%u", optLogGuess);
            maxBits = HUF_buildCTable_wksp(table, count, maxSymbolValue, optLogGuess, workSpace, wkspSize);
            if (ERR_isError(maxBits)) continue;

            if (maxBits < optLogGuess && optLogGuess > minTableLog) break;

            hSize = HUF_writeCTable_wksp(dst, dstSize, table, maxSymbolValue, (U32)maxBits, workSpace, wkspSize);

            if (ERR_isError(hSize)) continue;

            newSize = HUF_estimateCompressedSize(table, count, maxSymbolValue) + hSize;

            if (newSize > optSize + 1) {
                break;
            }

            if (newSize < optSize) {
                optSize = newSize;
                optLog = optLogGuess;
            }
        }
        assert(optLog <= HUF_TABLELOG_MAX);
        return optLog;
    }
}